

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_dcmpl(ExecutionEngine *this)

{
  uint uVar1;
  VMStack *this_00;
  Frame *this_01;
  Value VVar2;
  Value VVar3;
  Value resultado;
  ValueType VStack_4c;
  Value value_1;
  ValueType VStack_2c;
  Value value_2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  Frame::popTopOfOperandStack(this_01);
  VStack_2c = VVar2.type;
  if (VStack_2c != DOUBLE) {
    __assert_fail("value_2.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xba4,"void ExecutionEngine::i_dcmpl()");
  }
  VStack_4c = VVar3.type;
  if (VStack_4c != DOUBLE) {
    __assert_fail("value_1.type == ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xba5,"void ExecutionEngine::i_dcmpl()");
  }
  value_1._0_8_ = VVar3.data;
  uVar1 = std::isnan((double)value_1._0_8_);
  if ((uVar1 & 1) == 0) {
    value_2._0_8_ = VVar2.data;
    uVar1 = std::isnan((double)value_2._0_8_);
    if ((uVar1 & 1) == 0) {
      if ((double)value_1._0_8_ <= (double)value_2._0_8_) {
        if (((double)value_1._0_8_ != (double)value_2._0_8_) ||
           (NAN((double)value_1._0_8_) || NAN((double)value_2._0_8_))) {
          resultado.printType = ~BOOLEAN;
        }
        else {
          resultado.printType = BOOLEAN;
        }
      }
      else {
        resultado.printType = BYTE;
      }
      goto LAB_0013db23;
    }
  }
  resultado.printType = ~BOOLEAN;
LAB_0013db23:
  VVar2.data.longValue._4_4_ = resultado.type;
  VVar2.data.returnAddress = resultado.printType;
  VVar2.printType = INT;
  VVar2.type = INT;
  Frame::pushIntoOperandStack(this_01,VVar2);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_dcmpl() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();
	topFrame->popTopOfOperandStack();
	Value resultado;
    resultado.printType = ValueType::INT;
	resultado.type = ValueType::INT;

	assert(value_2.type == ValueType::DOUBLE);
	assert(value_1.type == ValueType::DOUBLE);

	if (isnan(value_1.data.doubleValue) || isnan(value_2.data.doubleValue)) {
		resultado.data.intValue = -1;
	} else if (value_1.data.doubleValue > value_2.data.doubleValue) {
		resultado.data.intValue = 1;
	} else if (value_1.data.doubleValue == value_2.data.doubleValue) {
		resultado.data.intValue = 0;
	} else {
		resultado.data.intValue = -1;
	}

	topFrame->pushIntoOperandStack(resultado);

	topFrame->pc += 1;
}